

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPubKeys
          (LegacyScriptPubKeyMan *this,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *key_origins,bool add_keypool,int64_t timestamp)

{
  Span<const_unsigned_char> s;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  type *ptVar4;
  ScriptPubKeyMan *this_00;
  const_iterator this_01;
  pointer ppVar5;
  mapped_type *pmVar6;
  KeyOriginInfo *in_RCX;
  CPubKey *in_RDX;
  WalletBatch *in_RSI;
  LegacyScriptPubKeyMan *in_RDI;
  byte in_R8B;
  WalletBatch *in_R9;
  long in_FS_OFFSET;
  CPubKey *pubkey;
  type *internal;
  type *id;
  vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_> *__range1_1;
  pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *entry;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range1;
  const_iterator entry_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  WalletBatch batch;
  CPubKey temp;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  WalletBatch *in_stack_fffffffffffffe68;
  undefined5 in_stack_fffffffffffffe78;
  byte in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  ConstevalFormatString<1U> in_stack_fffffffffffffed8;
  undefined7 uVar7;
  undefined1 internal_00;
  undefined7 in_stack_fffffffffffffef0;
  LegacyScriptPubKeyMan *this_02;
  bool local_e1;
  undefined1 local_49 [65];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R8B & 1;
  this_02 = in_RDI;
  (*((in_RDI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])();
  WalletBatch::WalletBatch
            (in_stack_fffffffffffffe68,
             (WalletDatabase *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  uVar7 = SUB87(in_RCX,0);
  internal_00 = (undefined1)((ulong)in_RCX >> 0x38);
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                                 (_Self *)CONCAT17(in_stack_fffffffffffffe67,
                                                   in_stack_fffffffffffffe60)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffed8.fmt =
         (char *)std::
                 _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    AddKeyOriginWithDB(this_02,in_RSI,in_RDX,in_RCX);
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  }
  std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>::begin
            ((vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>::end
            ((vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  do {
    bVar2 = __gnu_cxx::
            operator==<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
                      ((__normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
                        *)in_stack_fffffffffffffe68,
                       (__normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_e1 = true;
LAB_00a1eb00:
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_e1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    ptVar4 = std::get<0ul,CKeyID,bool>
                       ((pair<CKeyID,_bool> *)
                        CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    this_00 = (ScriptPubKeyMan *)
              std::get<1ul,CKeyID,bool>
                        ((pair<CKeyID,_bool> *)
                         CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    this_01 = std::
              map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
              ::find((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                     (key_type *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
           *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe68,
                            (_Self *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    if (!bVar2) {
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                          CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppVar5->second;
      CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      bVar3 = (*(code *)(((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                           *)&(in_RDI->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                              _vptr_ScriptPubKeyMan)->_M_t).
                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl[0x1f].
                        _vptr_DatabaseBatch)(in_RDI,ptVar4,local_49);
      if ((bVar3 & 1) == 0) {
        GetScriptForRawPubKey((CPubKey *)params);
        in_stack_fffffffffffffe7e =
             AddWatchOnlyWithDB((LegacyScriptPubKeyMan *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (WalletBatch *)in_RDI,(CScript *)this_01._M_node,
                                CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffe7e,
                                                        CONCAT15(in_stack_fffffffffffffe7d,
                                                                 in_stack_fffffffffffffe78))));
        in_stack_fffffffffffffe7d = in_stack_fffffffffffffe7e ^ 0xff;
        in_stack_fffffffffffffe68 = in_R9;
        CScript::~CScript((CScript *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        if ((in_stack_fffffffffffffe7d & 1) != 0) {
          local_e1 = false;
          goto LAB_00a1eb00;
        }
        in_R9 = in_stack_fffffffffffffe68;
        pmVar6 = std::
                 map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                               *)this_01._M_node,
                              (key_type *)
                              CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffe7e,
                                                      CONCAT15(in_stack_fffffffffffffe7d,
                                                               in_stack_fffffffffffffe78))));
        pmVar6->nCreateTime = (int64_t)in_stack_fffffffffffffe68;
        if ((bVar1 & 1) != 0) {
          AddKeypoolPubkeyWithDB
                    ((LegacyScriptPubKeyMan *)CONCAT17(bVar1,in_stack_fffffffffffffef0),
                     (CPubKey *)in_R9,(bool)internal_00,(WalletBatch *)in_stack_fffffffffffffed8.fmt
                    );
          boost::signals2::
          signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
          ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                        *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        }
      }
      else {
        Span<const_unsigned_char>::Span<CPubKey>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffe68,
                   (CPubKey *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   (type)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        s.m_data._7_1_ = internal_00;
        s.m_data._0_7_ = uVar7;
        s.m_size = (size_t)in_R9;
        HexStr_abi_cxx11_(s);
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  (this_00,in_stack_fffffffffffffed8,params);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<CKeyID,_bool>_*,_std::vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  } while( true );
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPubKeys(const std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys, const std::map<CKeyID, CPubKey>& pubkey_map, const std::map<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& key_origins, const bool add_keypool, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : key_origins) {
        AddKeyOriginWithDB(batch, entry.second.first, entry.second.second);
    }
    for (const auto& [id, internal] : ordered_pubkeys) {
        auto entry = pubkey_map.find(id);
        if (entry == pubkey_map.end()) {
            continue;
        }
        const CPubKey& pubkey = entry->second;
        CPubKey temp;
        if (GetPubKey(id, temp)) {
            // Already have pubkey, skipping
            WalletLogPrintf("Already have pubkey %s, skipping\n", HexStr(temp));
            continue;
        }
        if (!AddWatchOnlyWithDB(batch, GetScriptForRawPubKey(pubkey), timestamp)) {
            return false;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;

        // Add to keypool only works with pubkeys
        if (add_keypool) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
            NotifyCanGetAddressesChanged();
        }
    }
    return true;
}